

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acb.h
# Opt level: O0

void Acb_NtkCleanObjCounts(Acb_Ntk_t *p)

{
  int nSize;
  Acb_Ntk_t *p_local;
  
  nSize = Vec_StrCap(&p->vObjType);
  Vec_FltFill(&p->vCounts,nSize,0.0);
  return;
}

Assistant:

static inline void           Acb_NtkCleanObjCounts( Acb_Ntk_t * p )          { Vec_FltFill(&p->vCounts,   Vec_StrCap(&p->vObjType),  0);                                   }